

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O2

void __thiscall shift_window_transformer::StageModule<float>::~StageModule(StageModule<float> *this)

{
  pointer ppSVar1;
  SwinBlock<float> *this_00;
  int i;
  ulong uVar2;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010ba28;
  for (uVar2 = 0;
      ppSVar1 = (this->layers).
                super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->layers).
                            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppSVar1[uVar2];
    if (this_00 != (SwinBlock<float> *)0x0) {
      SwinBlock<float>::~SwinBlock(this_00);
    }
    operator_delete(this_00,0x38);
  }
  std::
  _Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ::~_Vector_base(&(this->layers).
                   super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                 );
  PatchMerging<float>::~PatchMerging(&this->patch_partition);
  return;
}

Assistant:

~StageModule() {
            for (int i = 0; i < layers.size(); ++i) {
                delete layers[i];
            }
        }